

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_ManBmcTerSimTestPo(Aig_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  long lVar1;
  
  __ptr = Saig_ManBmcTerSimPo(p);
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar1]) {
          free(__ptr->pArray[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Saig_ManBmcTerSimTestPo( Aig_Man_t * p )
{
    Vec_Ptr_t * vInfos;
    vInfos = Saig_ManBmcTerSimPo( p );
    Vec_PtrFreeFree( vInfos );
}